

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O1

int mbedtls_dhm_make_params
              (mbedtls_dhm_context *ctx,int x_size,uchar *output,size_t *olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *X;
  mbedtls_mpi *X_00;
  mbedtls_mpi *X_01;
  mbedtls_mpi *A;
  uchar *buf;
  int iVar1;
  int iVar2;
  size_t buflen;
  size_t buflen_00;
  size_t buflen_01;
  uchar *buf_00;
  int iVar3;
  
  X = &ctx->P;
  iVar3 = 0;
  iVar1 = mbedtls_mpi_cmp_int(X,0);
  if (iVar1 == 0) {
    iVar1 = -0x3080;
  }
  else {
    X_00 = &ctx->X;
    do {
      mbedtls_mpi_fill_random(X_00,(long)x_size,f_rng,p_rng);
      while (iVar1 = mbedtls_mpi_cmp_mpi(X_00,X), -1 < iVar1) {
        iVar2 = mbedtls_mpi_shift_r(X_00,1);
        if (iVar2 != 0) goto LAB_0018f990;
      }
      if (iVar3 == 0xb) {
        return -0x3180;
      }
      iVar3 = iVar3 + 1;
      iVar1 = dhm_check_range(X_00,X);
    } while (iVar1 != 0);
    X_01 = &ctx->GX;
    A = &ctx->G;
    iVar2 = mbedtls_mpi_exp_mod(X_01,A,X_00,X,&ctx->RP);
    if (iVar2 == 0) {
      iVar1 = dhm_check_range(X_01,X);
      if (iVar1 != 0) {
        return iVar1;
      }
      buflen = mbedtls_mpi_size(X);
      buflen_00 = mbedtls_mpi_size(A);
      buflen_01 = mbedtls_mpi_size(X_01);
      buf = output + 2;
      iVar2 = mbedtls_mpi_write_binary(X,buf,buflen);
      if (iVar2 == 0) {
        *(ushort *)output = (ushort)buflen << 8 | (ushort)buflen >> 8;
        buf_00 = buf + buflen + 2;
        iVar2 = mbedtls_mpi_write_binary(A,buf_00,buflen_00);
        if (iVar2 == 0) {
          *(ushort *)(buf + buflen) = (ushort)buflen_00 << 8 | (ushort)buflen_00 >> 8;
          iVar2 = mbedtls_mpi_write_binary(X_01,buf_00 + buflen_00 + 2,buflen_01);
          if (iVar2 == 0) {
            *(ushort *)(buf_00 + buflen_00) = (ushort)buflen_01 << 8 | (ushort)buflen_01 >> 8;
            *olen = (size_t)(buf_00 + buflen_00 + 2 + (buflen_01 - (long)output));
            ctx->len = buflen;
            iVar2 = 0;
          }
        }
      }
    }
LAB_0018f990:
    iVar1 = iVar2 + -0x3180;
    if (iVar2 == 0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_dhm_make_params( mbedtls_dhm_context *ctx, int x_size,
                     unsigned char *output, size_t *olen,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret, count = 0;
    size_t n1, n2, n3;
    unsigned char *p;

    if( mbedtls_mpi_cmp_int( &ctx->P, 0 ) == 0 )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    /*
     * Generate X as large as possible ( < P )
     */
    do
    {
        mbedtls_mpi_fill_random( &ctx->X, x_size, f_rng, p_rng );

        while( mbedtls_mpi_cmp_mpi( &ctx->X, &ctx->P ) >= 0 )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( &ctx->X, 1 ) );

        if( count++ > 10 )
            return( MBEDTLS_ERR_DHM_MAKE_PARAMS_FAILED );
    }
    while( dhm_check_range( &ctx->X, &ctx->P ) != 0 );

    /*
     * Calculate GX = G^X mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &ctx->GX, &ctx->G, &ctx->X,
                          &ctx->P , &ctx->RP ) );

    if( ( ret = dhm_check_range( &ctx->GX, &ctx->P ) ) != 0 )
        return( ret );

    /*
     * export P, G, GX
     */
#define DHM_MPI_EXPORT(X,n)                     \
    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( X, p + 2, n ) ); \
    *p++ = (unsigned char)( n >> 8 );           \
    *p++ = (unsigned char)( n      ); p += n;

    n1 = mbedtls_mpi_size( &ctx->P  );
    n2 = mbedtls_mpi_size( &ctx->G  );
    n3 = mbedtls_mpi_size( &ctx->GX );

    p = output;
    DHM_MPI_EXPORT( &ctx->P , n1 );
    DHM_MPI_EXPORT( &ctx->G , n2 );
    DHM_MPI_EXPORT( &ctx->GX, n3 );

    *olen  = p - output;

    ctx->len = n1;

cleanup:

    if( ret != 0 )
        return( MBEDTLS_ERR_DHM_MAKE_PARAMS_FAILED + ret );

    return( 0 );
}